

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmScanDepFormat.cxx
# Opt level: O0

bool cmScanDepFormat_P1689_Write(string *path,cmScanDepInfo *info)

{
  LookupMethod LVar1;
  bool bVar2;
  byte bVar3;
  Value *pVVar4;
  Value *pVVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *pvVar6;
  reference pcVar7;
  ulong uVar8;
  undefined1 local_6d8 [8];
  cmGeneratedFileStream ddif;
  char *local_448;
  char *lookup_method;
  Value local_418;
  Value local_3f0;
  Value local_3c8;
  undefined1 local_3a0 [8];
  Value encoded_1;
  Value require_obj;
  cmSourceReqInfo *require;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *__range1_2;
  Value *local_308;
  Value *reqs;
  Value local_2d8;
  Value local_2b0;
  Value local_288;
  Value local_260;
  undefined1 local_238 [8];
  Value encoded;
  Value provide_obj;
  cmSourceReqInfo *provide;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *__range1_1;
  Value *local_1a0;
  Value *provides;
  reference local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *output;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  Value *local_128;
  Value *rule_outputs;
  undefined1 local_f8 [8];
  Value rule;
  Value *rules;
  Value local_68;
  undefined1 local_40 [8];
  Value ddi;
  cmScanDepInfo *info_local;
  string *path_local;
  
  ddi.limit_ = (ptrdiff_t)info;
  Json::Value::Value((Value *)local_40,objectValue);
  Json::Value::Value(&local_68,0);
  pVVar4 = Json::Value::operator[]((Value *)local_40,"version");
  Json::Value::operator=(pVVar4,&local_68);
  Json::Value::~Value(&local_68);
  Json::Value::Value((Value *)&rules,0);
  pVVar4 = Json::Value::operator[]((Value *)local_40,"revision");
  Json::Value::operator=(pVVar4,(Value *)&rules);
  Json::Value::~Value((Value *)&rules);
  Json::Value::Value((Value *)&rule.limit_,arrayValue);
  pVVar4 = Json::Value::operator[]((Value *)local_40,"rules");
  pVVar4 = Json::Value::operator=(pVVar4,(Value *)&rule.limit_);
  Json::Value::~Value((Value *)&rule.limit_);
  Json::Value::Value((Value *)local_f8,objectValue);
  EncodeFilename((Value *)&rule_outputs,(string *)ddi.limit_);
  pVVar5 = Json::Value::operator[]((Value *)local_f8,"primary-output");
  Json::Value::operator=(pVVar5,(Value *)&rule_outputs);
  Json::Value::~Value((Value *)&rule_outputs);
  Json::Value::Value((Value *)&__range1,arrayValue);
  pVVar5 = Json::Value::operator[]((Value *)local_f8,"outputs");
  pVVar5 = Json::Value::operator=(pVVar5,(Value *)&__range1);
  Json::Value::~Value((Value *)&__range1);
  this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)(ddi.limit_ + 0x20);
  local_128 = pVVar5;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this);
  output = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&output), bVar2) {
    local_170 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    pVVar5 = local_128;
    EncodeFilename((Value *)&provides,local_170);
    Json::Value::append(pVVar5,(Value *)&provides);
    Json::Value::~Value((Value *)&provides);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  Json::Value::Value((Value *)&__range1_1,arrayValue);
  pVVar5 = Json::Value::operator[]((Value *)local_f8,"provides");
  pVVar5 = Json::Value::operator=(pVVar5,(Value *)&__range1_1);
  Json::Value::~Value((Value *)&__range1_1);
  pvVar6 = (vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *)(ddi.limit_ + 0x38);
  local_1a0 = pVVar5;
  __end1_1 = std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::begin(pvVar6);
  provide = (cmSourceReqInfo *)
            std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::end(pvVar6);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
                             *)&provide), bVar2) {
    pcVar7 = __gnu_cxx::
             __normal_iterator<const_cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
             ::operator*(&__end1_1);
    Json::Value::Value((Value *)&encoded.limit_,objectValue);
    EncodeFilename((Value *)local_238,&pcVar7->LogicalName);
    pVVar5 = Json::Value::operator[]((Value *)&encoded.limit_,"logical-name");
    Json::Value::operator=(pVVar5,(Value *)local_238);
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      EncodeFilename(&local_260,&pcVar7->CompiledModulePath);
      pVVar5 = Json::Value::operator[]((Value *)&encoded.limit_,"compiled-module-path");
      Json::Value::operator=(pVVar5,&local_260);
      Json::Value::~Value(&local_260);
    }
    if ((pcVar7->UseSourcePath & 1U) == 0) {
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        EncodeFilename(&local_2d8,&pcVar7->SourcePath);
        pVVar5 = Json::Value::operator[]((Value *)&encoded.limit_,"source-path");
        Json::Value::operator=(pVVar5,&local_2d8);
        Json::Value::~Value(&local_2d8);
      }
    }
    else {
      Json::Value::Value(&local_288,true);
      pVVar5 = Json::Value::operator[]((Value *)&encoded.limit_,"unique-on-source-path");
      Json::Value::operator=(pVVar5,&local_288);
      Json::Value::~Value(&local_288);
      EncodeFilename(&local_2b0,&pcVar7->SourcePath);
      pVVar5 = Json::Value::operator[]((Value *)&encoded.limit_,"source-path");
      Json::Value::operator=(pVVar5,&local_2b0);
      Json::Value::~Value(&local_2b0);
    }
    Json::Value::Value((Value *)&reqs,(bool)(pcVar7->IsInterface & 1));
    pVVar5 = Json::Value::operator[]((Value *)&encoded.limit_,"is-interface");
    Json::Value::operator=(pVVar5,(Value *)&reqs);
    Json::Value::~Value((Value *)&reqs);
    Json::Value::append(local_1a0,(Value *)&encoded.limit_);
    Json::Value::~Value((Value *)local_238);
    Json::Value::~Value((Value *)&encoded.limit_);
    __gnu_cxx::
    __normal_iterator<const_cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
    ::operator++(&__end1_1);
  }
  Json::Value::Value((Value *)&__range1_2,arrayValue);
  pVVar5 = Json::Value::operator[]((Value *)local_f8,"requires");
  pVVar5 = Json::Value::operator=(pVVar5,(Value *)&__range1_2);
  Json::Value::~Value((Value *)&__range1_2);
  pvVar6 = (vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_> *)(ddi.limit_ + 0x50);
  local_308 = pVVar5;
  __end1_2 = std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::begin(pvVar6);
  require = (cmSourceReqInfo *)
            std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>::end(pvVar6);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<const_cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
                             *)&require), bVar2) {
    pcVar7 = __gnu_cxx::
             __normal_iterator<const_cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
             ::operator*(&__end1_2);
    Json::Value::Value((Value *)&encoded_1.limit_,objectValue);
    EncodeFilename((Value *)local_3a0,&pcVar7->LogicalName);
    pVVar5 = Json::Value::operator[]((Value *)&encoded_1.limit_,"logical-name");
    Json::Value::operator=(pVVar5,(Value *)local_3a0);
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      EncodeFilename(&local_3c8,&pcVar7->CompiledModulePath);
      pVVar5 = Json::Value::operator[]((Value *)&encoded_1.limit_,"compiled-module-path");
      Json::Value::operator=(pVVar5,&local_3c8);
      Json::Value::~Value(&local_3c8);
    }
    if ((pcVar7->UseSourcePath & 1U) == 0) {
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        EncodeFilename((Value *)&lookup_method,&pcVar7->SourcePath);
        pVVar5 = Json::Value::operator[]((Value *)&encoded_1.limit_,"source-path");
        Json::Value::operator=(pVVar5,(Value *)&lookup_method);
        Json::Value::~Value((Value *)&lookup_method);
      }
    }
    else {
      Json::Value::Value(&local_3f0,true);
      pVVar5 = Json::Value::operator[]((Value *)&encoded_1.limit_,"unique-on-source-path");
      Json::Value::operator=(pVVar5,&local_3f0);
      Json::Value::~Value(&local_3f0);
      EncodeFilename(&local_418,&pcVar7->SourcePath);
      pVVar5 = Json::Value::operator[]((Value *)&encoded_1.limit_,"source-path");
      Json::Value::operator=(pVVar5,&local_418);
      Json::Value::~Value(&local_418);
    }
    local_448 = (char *)0x0;
    LVar1 = pcVar7->Method;
    if (LVar1 != ByName) {
      if (LVar1 == IncludeAngle) {
        local_448 = "include-angle";
      }
      else if (LVar1 == IncludeQuote) {
        local_448 = "include-quote";
      }
    }
    if (local_448 != (char *)0x0) {
      Json::Value::Value((Value *)&ddif.field_0x260,local_448);
      pVVar5 = Json::Value::operator[]((Value *)&encoded_1.limit_,"lookup-method");
      Json::Value::operator=(pVVar5,(Value *)&ddif.field_0x260);
      Json::Value::~Value((Value *)&ddif.field_0x260);
    }
    Json::Value::append(local_308,(Value *)&encoded_1.limit_);
    Json::Value::~Value((Value *)local_3a0);
    Json::Value::~Value((Value *)&encoded_1.limit_);
    __gnu_cxx::
    __normal_iterator<const_cmSourceReqInfo_*,_std::vector<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>_>
    ::operator++(&__end1_2);
  }
  Json::Value::append(pVVar4,(Value *)local_f8);
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_6d8,path,false,None);
  Json::operator<<((OStream *)local_6d8,(Value *)local_40);
  bVar3 = std::ios::operator!((ios *)(local_6d8 + (long)*(_func_int **)((long)local_6d8 + -0x18)));
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_6d8);
  Json::Value::~Value((Value *)local_f8);
  Json::Value::~Value((Value *)local_40);
  return (bool)((bVar3 ^ 0xff) & 1);
}

Assistant:

bool cmScanDepFormat_P1689_Write(std::string const& path,
                                 cmScanDepInfo const& info)
{
  Json::Value ddi(Json::objectValue);
  ddi["version"] = 0;
  ddi["revision"] = 0;

  Json::Value& rules = ddi["rules"] = Json::arrayValue;

  Json::Value rule(Json::objectValue);

  rule["primary-output"] = EncodeFilename(info.PrimaryOutput);

  Json::Value& rule_outputs = rule["outputs"] = Json::arrayValue;
  for (auto const& output : info.ExtraOutputs) {
    rule_outputs.append(EncodeFilename(output));
  }

  Json::Value& provides = rule["provides"] = Json::arrayValue;
  for (auto const& provide : info.Provides) {
    Json::Value provide_obj(Json::objectValue);
    auto const encoded = EncodeFilename(provide.LogicalName);
    provide_obj["logical-name"] = encoded;
    if (!provide.CompiledModulePath.empty()) {
      provide_obj["compiled-module-path"] =
        EncodeFilename(provide.CompiledModulePath);
    }

    if (provide.UseSourcePath) {
      provide_obj["unique-on-source-path"] = true;
      provide_obj["source-path"] = EncodeFilename(provide.SourcePath);
    } else if (!provide.SourcePath.empty()) {
      provide_obj["source-path"] = EncodeFilename(provide.SourcePath);
    }

    provide_obj["is-interface"] = provide.IsInterface;

    provides.append(provide_obj);
  }

  Json::Value& reqs = rule["requires"] = Json::arrayValue;
  for (auto const& require : info.Requires) {
    Json::Value require_obj(Json::objectValue);
    auto const encoded = EncodeFilename(require.LogicalName);
    require_obj["logical-name"] = encoded;
    if (!require.CompiledModulePath.empty()) {
      require_obj["compiled-module-path"] =
        EncodeFilename(require.CompiledModulePath);
    }

    if (require.UseSourcePath) {
      require_obj["unique-on-source-path"] = true;
      require_obj["source-path"] = EncodeFilename(require.SourcePath);
    } else if (!require.SourcePath.empty()) {
      require_obj["source-path"] = EncodeFilename(require.SourcePath);
    }

    const char* lookup_method = nullptr;
    switch (require.Method) {
      case LookupMethod::ByName:
        // No explicit value needed for the default.
        break;
      case LookupMethod::IncludeAngle:
        lookup_method = "include-angle";
        break;
      case LookupMethod::IncludeQuote:
        lookup_method = "include-quote";
        break;
    }
    if (lookup_method) {
      require_obj["lookup-method"] = lookup_method;
    }

    reqs.append(require_obj);
  }

  rules.append(rule);

  cmGeneratedFileStream ddif(path);
  ddif << ddi;

  return !!ddif;
}